

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  Database db;
  Column local_d0;
  Column local_b8;
  Statement query;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"SQlite3 version ");
  poVar3 = std::operator<<(poVar3,"3.39.3");
  poVar3 = std::operator<<(poVar3," (");
  pcVar4 = SQLite::getLibVersion();
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,")");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"SQliteC++ version ");
  poVar3 = std::operator<<(poVar3,"3.02.00");
  std::endl<char,std::char_traits<char>>(poVar3);
  SQLite::Database::Database(&db,"test.db3",6,0,(char *)0x0);
  poVar3 = std::operator<<((ostream *)&std::cout,"SQLite database file \'");
  poVar3 = std::operator<<(poVar3,db.mFilename._M_dataplus._M_p);
  std::operator<<(poVar3,"\' opened successfully\n");
  SQLite::Database::exec(&db,"DROP TABLE IF EXISTS test");
  SQLite::Database::exec(&db,"CREATE TABLE test (id INTEGER PRIMARY KEY, value TEXT)");
  iVar2 = SQLite::Database::exec(&db,"INSERT INTO test VALUES (NULL, \"test\")");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "INSERT INTO test VALUES (NULL, \"test\")\", returned ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar2 = SQLite::Database::exec(&db,"INSERT INTO test VALUES (NULL, \"second\")");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "INSERT INTO test VALUES (NULL, \"second\")\", returned ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar2 = SQLite::Database::exec(&db,"UPDATE test SET value=\"second-updated\" WHERE id=\'2\'");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "UPDATE test SET value=\"second-updated\" WHERE id=\'2\', returned ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  SQLite::Statement::Statement(&query,&db,"SELECT * FROM test");
  std::operator<<((ostream *)&std::cout,"SELECT * FROM test :\n");
  while( true ) {
    bVar1 = SQLite::Statement::executeStep(&query);
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"row (");
    SQLite::Statement::getColumn(&local_b8,&query,0);
    poVar3 = SQLite::operator<<(poVar3,&local_b8);
    poVar3 = std::operator<<(poVar3,", \"");
    SQLite::Statement::getColumn(&local_d0,&query,1);
    poVar3 = SQLite::operator<<(poVar3,&local_d0);
    std::operator<<(poVar3,"\")\n");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_d0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  SQLite::Database::exec(&db,"DROP TABLE test");
  SQLite::Statement::~Statement(&query);
  SQLite::Database::~Database(&db);
  remove("test.db3");
  std::operator<<((ostream *)&std::cout,"everything ok, quitting\n");
  return 0;
}

Assistant:

int main ()
{
    // Using SQLITE_VERSION would require #include <sqlite3.h> which we want to avoid: use SQLite::VERSION if possible.
//  std::cout << "SQlite3 version " << SQLITE_VERSION << std::endl;
    std::cout << "SQlite3 version " << SQLite::VERSION << " (" << SQLite::getLibVersion() << ")" << std::endl;
    std::cout << "SQliteC++ version " << SQLITECPP_VERSION << std::endl;

    ////////////////////////////////////////////////////////////////////////////
    // Simple batch queries example :
    try
    {
        // Open a database file in create/write mode
        SQLite::Database    db("test.db3", SQLite::OPEN_READWRITE|SQLite::OPEN_CREATE);
        std::cout << "SQLite database file '" << db.getFilename().c_str() << "' opened successfully\n";

        // Create a new table with an explicit "id" column aliasing the underlying rowid
        db.exec("DROP TABLE IF EXISTS test");
        db.exec("CREATE TABLE test (id INTEGER PRIMARY KEY, value TEXT)");

        // first row
        int nb = db.exec("INSERT INTO test VALUES (NULL, \"test\")");
        std::cout << "INSERT INTO test VALUES (NULL, \"test\")\", returned " << nb << std::endl;

        // second row
        nb = db.exec("INSERT INTO test VALUES (NULL, \"second\")");
        std::cout << "INSERT INTO test VALUES (NULL, \"second\")\", returned " << nb << std::endl;

        // update the second row
        nb = db.exec("UPDATE test SET value=\"second-updated\" WHERE id='2'");
        std::cout << "UPDATE test SET value=\"second-updated\" WHERE id='2', returned " << nb << std::endl;

        // Check the results : expect two row of result
        SQLite::Statement   query(db, "SELECT * FROM test");
        std::cout << "SELECT * FROM test :\n";
        while (query.executeStep())
        {
            std::cout << "row (" << query.getColumn(0) << ", \"" << query.getColumn(1) << "\")\n";
        }

        db.exec("DROP TABLE test");
    }
    catch (std::exception& e)
    {
        std::cout << "SQLite exception: " << e.what() << std::endl;
        return EXIT_FAILURE; // unexpected error : exit the example program
    }
    remove("test.db3");

    std::cout << "everything ok, quitting\n";

    return EXIT_SUCCESS;
}